

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::timerEvent(QTableView *this,QTimerEvent *event)

{
  bool bVar1;
  TimerId TVar2;
  TimerId TVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QTableViewPrivate *pQVar7;
  QHeaderViewPrivate *pQVar8;
  const_reference piVar9;
  qsizetype qVar10;
  int *piVar11;
  QTimerEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int viewportWidth_1;
  int viewportHeight_1;
  int oldScrollMax_1;
  int x;
  int column;
  int i;
  int viewportWidth;
  int viewportHeight;
  int oldScrollMax;
  QTableViewPrivate *d;
  int y;
  int top;
  QRect rect;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  QRect *in_stack_ffffffffffffff20;
  QWidget *rect_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int local_b0;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int local_60;
  int local_5c;
  undefined1 local_58 [16];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QTableView *)0x8bf5c5);
  TVar2 = QTimerEvent::id(in_RSI);
  TVar3 = QBasicTimer::id(&pQVar7->columnResizeTimer);
  if (TVar2 == TVar3) {
    QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff20);
    iVar4 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff20);
    horizontalHeader((QTableView *)in_stack_ffffffffffffff20);
    pQVar8 = QHeaderView::d_func((QHeaderView *)0x8bf61f);
    if (pQVar8->state == ResizeSection) {
      (**(code **)(*in_RDI + 0x260))();
    }
    else {
      (**(code **)(*in_RDI + 0x268))();
      QBasicTimer::stop();
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect(in_stack_ffffffffffffff20);
    QWidget::height((QWidget *)0x8bf693);
    in_stack_ffffffffffffff6c = QWidget::width((QWidget *)0x8bf6a8);
    bVar1 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8bf6b6);
    if (bVar1) {
LAB_008bf6d2:
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(int)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
      local_18 = local_28;
      local_10 = local_20;
    }
    else {
      QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff20);
      iVar5 = QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff20);
      if (iVar5 == iVar4) goto LAB_008bf6d2;
      qVar10 = QList<int>::size(&pQVar7->columnsToUpdate);
      in_stack_ffffffffffffff68 = (int)qVar10;
      while (in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 + -1,
            -1 < in_stack_ffffffffffffff68) {
        piVar9 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff20,
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        in_stack_ffffffffffffff64 = *piVar9;
        in_stack_ffffffffffffff60 =
             columnViewportPosition
                       ((QTableView *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        bVar1 = QWidget::isRightToLeft((QWidget *)0x8bf76d);
        if (bVar1) {
          columnWidth((QTableView *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       (int)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18);
          QRect::operator|=((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            in_stack_ffffffffffffff20);
        }
        else {
          QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       (int)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18);
          QRect::operator|=((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            in_stack_ffffffffffffff20);
        }
      }
    }
    local_58 = QRect::normalized();
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                    in_stack_ffffffffffffff20);
    QList<int>::clear((QList<int> *)in_stack_ffffffffffffff20);
  }
  TVar2 = QTimerEvent::id(in_RSI);
  TVar3 = QBasicTimer::id(&pQVar7->rowResizeTimer);
  if (TVar2 != TVar3) goto LAB_008bfa24;
  QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff20);
  iVar4 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff20);
  verticalHeader((QTableView *)in_stack_ffffffffffffff20);
  pQVar8 = QHeaderView::d_func((QHeaderView *)0x8bf8ab);
  if (pQVar8->state == ResizeSection) {
    (**(code **)(*in_RDI + 0x260))();
  }
  else {
    (**(code **)(*in_RDI + 0x268))();
    QBasicTimer::stop();
  }
  iVar5 = QWidget::height((QWidget *)0x8bf8f4);
  QWidget::width((QWidget *)0x8bf909);
  local_5c = -0x55555556;
  bVar1 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8bf922);
  if (bVar1) {
LAB_008bf93e:
    local_5c = 0;
  }
  else {
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff20);
    iVar6 = QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff20);
    if (iVar6 == iVar4) goto LAB_008bf93e;
    local_5c = iVar5;
    qVar10 = QList<int>::size(&pQVar7->rowsToUpdate);
    local_b0 = (int)qVar10;
    while (local_b0 = local_b0 + -1, -1 < local_b0) {
      QList<int>::at((QList<int> *)in_stack_ffffffffffffff20,
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_60 = rowViewportPosition((QTableView *)in_stack_ffffffffffffff20,
                                     in_stack_ffffffffffffff1c);
      piVar11 = qMin<int>(&local_5c,&local_60);
      local_5c = *piVar11;
    }
  }
  rect_00 = (pQVar7->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
  QRect::QRect((QRect *)CONCAT44(TVar2,in_stack_ffffffffffffff28),(int)((ulong)rect_00 >> 0x20),
               (int)rect_00,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  QWidget::update((QWidget *)CONCAT44(TVar2,in_stack_ffffffffffffff28),(QRect *)rect_00);
  QList<int>::clear((QList<int> *)rect_00);
LAB_008bfa24:
  QAbstractItemView::timerEvent
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (QTimerEvent *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::timerEvent(QTimerEvent *event)
{
    Q_D(QTableView);

    if (event->id() == d->columnResizeTimer.id()) {
        const int oldScrollMax = horizontalScrollBar()->maximum();
        if (horizontalHeader()->d_func()->state != QHeaderViewPrivate::ResizeSection) {
            updateGeometries();
            d->columnResizeTimer.stop();
        } else {
            updateEditorGeometries();
        }

        QRect rect;
        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        if (d->hasSpans() || horizontalScrollBar()->value() == oldScrollMax) {
            rect = QRect(0, 0, viewportWidth, viewportHeight);
        } else {
            for (int i = d->columnsToUpdate.size()-1; i >= 0; --i) {
                int column = d->columnsToUpdate.at(i);
                int x = columnViewportPosition(column);
                if (isRightToLeft())
                    rect |= QRect(0, 0, x + columnWidth(column), viewportHeight);
                else
                    rect |= QRect(x, 0, viewportWidth - x, viewportHeight);
            }
        }

        d->viewport->update(rect.normalized());
        d->columnsToUpdate.clear();
    }

    if (event->id() == d->rowResizeTimer.id()) {
        const int oldScrollMax = verticalScrollBar()->maximum();
        if (verticalHeader()->d_func()->state != QHeaderViewPrivate::ResizeSection) {
            updateGeometries();
            d->rowResizeTimer.stop();
        } else {
            updateEditorGeometries();
        }

        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        int top;
        if (d->hasSpans() || verticalScrollBar()->value() == oldScrollMax) {
            top = 0;
        } else {
            top = viewportHeight;
            for (int i = d->rowsToUpdate.size()-1; i >= 0; --i) {
                int y = rowViewportPosition(d->rowsToUpdate.at(i));
                top = qMin(top, y);
            }
        }

        d->viewport->update(QRect(0, top, viewportWidth, viewportHeight - top));
        d->rowsToUpdate.clear();
    }

    QAbstractItemView::timerEvent(event);
}